

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::EventLoop::EventLoop(EventLoop *this)

{
  TaskSet *pTVar1;
  
  this->port = (EventPort *)&kj::_::NullEventPort::instance;
  this->running = false;
  this->lastRunnableState = false;
  this->head = (Event *)0x0;
  this->tail = &this->head;
  this->depthFirstInsertPoint = &this->head;
  pTVar1 = (TaskSet *)operator_new(0x28);
  pTVar1->errorHandler = (ErrorHandler *)&kj::_::LoggingErrorHandler::instance;
  (pTVar1->tasks).ptr.disposer = (Disposer *)0x0;
  (pTVar1->tasks).ptr.ptr = (Task *)0x0;
  (pTVar1->emptyFulfiller).ptr.disposer = (Disposer *)0x0;
  (pTVar1->emptyFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  (this->daemons).disposer = (Disposer *)&kj::_::HeapDisposer<kj::TaskSet>::instance;
  (this->daemons).ptr = pTVar1;
  return;
}

Assistant:

EventLoop::EventLoop()
    : port(_::NullEventPort::instance),
      daemons(kj::heap<TaskSet>(_::LoggingErrorHandler::instance)) {}